

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::cone(Mesh *__return_storage_ptr__,float radius,float _height,int _radiusSegments,
                 int _heightSegments,int _capSegments,DrawMode _drawMode)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  DrawMode DVar4;
  int iVar5;
  ulong uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  int ix;
  int iVar10;
  uint32_t uVar11;
  int x;
  int iVar12;
  bool bVar13;
  float fVar14;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar21;
  float __x;
  float local_120;
  vec3 vert;
  float local_d0;
  vec2 tcoord;
  float radius_local;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_c0;
  ulong uStack_bc;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_b0;
  ulong uStack_ac;
  float maxTexYNormalized;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_9c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_98;
  ulong local_90;
  ulong local_88;
  int local_7c;
  vec<3,_float,_(glm::qualifier)0> local_78;
  vec<3,_float,_(glm::qualifier)0> local_68;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  radius_local = radius;
  Mesh::Mesh(__return_storage_ptr__);
  DVar4 = TRIANGLE_STRIP;
  if (0xfffffffd < _drawMode - TRIANGLE_FAN) {
    DVar4 = _drawMode;
  }
  __return_storage_ptr__->m_drawMode = DVar4;
  iVar5 = _radiusSegments + 1;
  local_88 = 1;
  if (1 < _heightSegments) {
    local_88 = (ulong)(uint)_heightSegments;
  }
  iVar9 = (int)local_88;
  local_7c = iVar9 + 1;
  local_68.field_2.z = 0.0;
  uVar6 = 0;
  fVar14 = (float)iVar5 + -1.0;
  fVar18 = (float)local_7c + -1.0;
  fVar19 = _height * 0.5;
  local_58 = ZEXT416((uint)fVar19);
  local_68.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_68.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_90 = (ulong)(_capSegments + 1U);
  if (_capSegments < 1) {
    fVar20 = -0.0;
    local_90 = uVar6;
  }
  else {
    fVar20 = (float)(int)(_capSegments + 1U) + -1.0;
  }
  local_48 = -fVar19;
  uStack_40 = 0x80000000;
  uStack_3c = 0x80000000;
  uStack_44 = 0x80000000;
  while (iVar8 = (int)uVar6, iVar8 != local_7c) {
    aVar15.x = (float)iVar8;
    aVar21.y = (_height / fVar18) * aVar15.x + local_48;
    for (iVar10 = 0; iVar10 <= _radiusSegments; iVar10 = iVar10 + 1) {
      maxTexYNormalized = aVar15.x;
      auVar1._8_4_ = 0;
      auVar1._0_8_ = uStack_ac;
      _local_b0 = (vec<3,_float,_(glm::qualifier)0>)(auVar1 << 0x20);
      local_c0.x = (float)iVar9;
      local_120 = 0.0;
      fVar16 = remap(&maxTexYNormalized,&local_b0.x,&local_c0.x,&local_120,&radius_local,true);
      __x = (-6.2831855 / fVar14) * (float)iVar10;
      fVar17 = cosf(__x);
      vert.field_0.x = fVar17 * fVar16;
      vert.field_1.y = aVar21.y;
      fVar17 = sinf(__x);
      vert.field_2.z = fVar17 * fVar16;
      tcoord.field_0.x = (float)iVar10 / fVar14;
      tcoord.field_1.y = 1.0 - aVar15.x / (fVar20 + fVar18);
      Mesh::addTexCoord(__return_storage_ptr__,&tcoord);
      Mesh::addVertex(__return_storage_ptr__,&vert);
      if (iVar8 == 0) {
        vert.field_0.x = cosf(__x);
        vert.field_1.y = aVar21.y;
        vert.field_2.z = sinf(__x);
      }
      aStack_9c.y = vert.field_1.y - (-1.0 - fVar19);
      maxTexYNormalized = vert.field_0.x;
      local_98 = vert.field_2;
      _local_b0 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_68,&vert)
      ;
      local_78 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                           ((vec<3,_float,_(glm::qualifier)0> *)&local_b0,
                            (vec<3,_float,_(glm::qualifier)0> *)&maxTexYNormalized);
      _local_c0 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                            (&local_78);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_c0);
    }
    uVar6 = (ulong)(iVar8 + 1);
  }
  if (DVar4 == TRIANGLES) {
    uVar7 = 0;
    iVar9 = 0;
    if (0 < _radiusSegments) {
      iVar9 = _radiusSegments;
    }
    iVar8 = 0;
    while (iVar8 != (int)local_88) {
      iVar10 = iVar9;
      uVar11 = uVar7;
      while (bVar13 = iVar10 != 0, iVar10 = iVar10 + -1, bVar13) {
        if (iVar8 != 0) {
          Mesh::addIndex(__return_storage_ptr__,uVar11);
          Mesh::addIndex(__return_storage_ptr__,uVar11 + 1);
          Mesh::addIndex(__return_storage_ptr__,iVar5 + uVar11);
        }
        Mesh::addIndex(__return_storage_ptr__,uVar11 + 1);
        Mesh::addIndex(__return_storage_ptr__,uVar11 + _radiusSegments + 2);
        Mesh::addIndex(__return_storage_ptr__,uVar11 + iVar5);
        uVar11 = uVar11 + 1;
      }
      uVar7 = uVar7 + iVar5;
      iVar8 = iVar8 + 1;
    }
  }
  else {
    iVar8 = 0;
    iVar9 = 0;
    while (iVar10 = iVar9, iVar8 != (int)local_88) {
      iVar8 = iVar8 + 1;
      iVar9 = iVar5 + iVar10;
      for (iVar12 = 0; iVar12 <= _radiusSegments; iVar12 = iVar12 + 1) {
        Mesh::addIndex(__return_storage_ptr__,iVar10 + iVar12);
        Mesh::addIndex(__return_storage_ptr__,iVar9 + iVar12);
      }
    }
  }
  uVar6 = ((long)(__return_storage_ptr__->m_vertices).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->m_vertices).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  maxTexYNormalized = fVar18 / (fVar20 + fVar18);
  local_78 = (vec<3,_float,_(glm::qualifier)0>)ZEXT812(0x3f80000000000000);
  iVar9 = (int)local_90;
  iVar8 = iVar9 + -1;
  iVar10 = 0;
  local_90 = local_90 & 0xffffffff;
  if (iVar9 < 1) {
    local_90 = 0;
  }
  for (; iVar10 != (int)local_90; iVar10 = iVar10 + 1) {
    for (iVar9 = 0; iVar9 <= _radiusSegments; iVar9 = iVar9 + 1) {
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uStack_bc;
      _local_c0 = (vec<3,_float,_(glm::qualifier)0>)(auVar2 << 0x20);
      local_d0 = 0.0;
      local_120 = (float)iVar8;
      local_b0.x = (float)iVar10;
      fVar18 = remap(&local_b0.x,&local_c0.x,&local_120,&radius_local,&local_d0,true);
      fVar19 = (-6.2831855 / fVar14) * (float)iVar9;
      fVar20 = cosf(fVar19);
      vert.field_0.x = fVar20 * fVar18;
      fVar19 = sinf(fVar19);
      vert.field_2.z = fVar19 * fVar18;
      vert.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_58._0_4_;
      tcoord.field_0.x = (float)iVar9 / fVar14;
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uStack_bc;
      _local_c0 = (vec<3,_float,_(glm::qualifier)0>)(auVar3 << 0x20);
      local_b0.x = (float)iVar10;
      local_d0 = 1.0;
      local_120 = (float)iVar8;
      fVar18 = remap(&local_b0.x,&local_c0.x,&local_120,&maxTexYNormalized,&local_d0,true);
      tcoord.field_1.y = 1.0 - fVar18;
      Mesh::addTexCoord(__return_storage_ptr__,&tcoord);
      Mesh::addVertex(__return_storage_ptr__,&vert);
      Mesh::addNormal(__return_storage_ptr__,&local_78);
    }
  }
  if (DVar4 == TRIANGLES) {
    if (0 < _capSegments) {
      uVar7 = (int)uVar6 + 1;
      iVar10 = 0;
      iVar9 = 0;
      if (0 < _radiusSegments) {
        iVar9 = _radiusSegments;
      }
      if (iVar8 < 1) {
        iVar8 = iVar10;
      }
      while (iVar10 != iVar8) {
        iVar12 = iVar9;
        uVar11 = uVar7;
        while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
          Mesh::addIndex(__return_storage_ptr__,uVar11 - 1);
          Mesh::addIndex(__return_storage_ptr__,uVar11);
          Mesh::addIndex(__return_storage_ptr__,_radiusSegments + uVar11);
          if (iVar10 < _capSegments + -1) {
            Mesh::addIndex(__return_storage_ptr__,uVar11);
            Mesh::addIndex(__return_storage_ptr__,_radiusSegments + uVar11 + 1);
            Mesh::addIndex(__return_storage_ptr__,_radiusSegments + uVar11);
          }
          uVar11 = uVar11 + 1;
        }
        uVar7 = uVar7 + iVar5;
        iVar10 = iVar10 + 1;
      }
    }
  }
  else if (0 < _capSegments) {
    iVar9 = 0;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    iVar10 = _radiusSegments + (int)uVar6 + 1;
    while (iVar9 != iVar8) {
      iVar9 = iVar9 + 1;
      for (iVar12 = 0; iVar12 <= _radiusSegments; iVar12 = iVar12 + 1) {
        Mesh::addIndex(__return_storage_ptr__,(int)uVar6 + iVar12);
        Mesh::addIndex(__return_storage_ptr__,iVar10 + iVar12);
      }
      iVar10 = iVar10 + iVar5;
      uVar6 = (ulong)(uint)((int)uVar6 + iVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh cone( float radius, float _height, int _radiusSegments, int _heightSegments, int _capSegments, DrawMode _drawMode ) {
    Mesh mesh;
    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLE_STRIP;

    mesh.setDrawMode(_drawMode);

    _radiusSegments = _radiusSegments+1;
    _capSegments = _capSegments+1;
    _heightSegments = _heightSegments+1;
    if (_heightSegments < 2) _heightSegments = 2;
    int capSegs = _capSegments;
    if ( capSegs < 2 )
        capSegs = 0;

    float angleIncRadius = -1.f * ((TAU/((float)_radiusSegments-1.f)));
    float heightInc = _height/((float)_heightSegments-1);
    float halfH = _height*.5f;

    float newRad;
    glm::vec3 vert;
    glm::vec3 normal;
    glm::vec2 tcoord;
    glm::vec3 up(0.0,1.0,0.0);

    std::size_t vertOffset = 0;

    float maxTexY = _heightSegments-1.f;
    if (capSegs > 0) 
        maxTexY += capSegs-1.f;

    glm::vec3 startVec(0, -halfH-1.f, 0);

    // cone vertices //
    for (int iy = 0; iy < _heightSegments; iy++) {
        for (int ix = 0; ix < _radiusSegments; ix++) {

            newRad = remap((float)iy, 0, _heightSegments-1, 0.0, radius, true);
            vert.x = cos((float)ix*angleIncRadius) * newRad;
            vert.y = heightInc*((float)iy) - halfH;
            vert.z = sin((float)ix*angleIncRadius) * newRad;

            tcoord.x = (float)ix/((float)_radiusSegments-1.f);
            tcoord.y = 1.f - (float)iy/((float)maxTexY);

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );

            if (iy == 0) {
                newRad = 1.f;
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.y = heightInc*((float)iy) - halfH;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
            }

            glm::vec3 diff = vert - startVec;
            glm::vec3 crossed = glm::cross(up, vert);
            normal = glm::cross(crossed, diff);
            mesh.addNormal( glm::normalize(normal) );

        }
    }

    if (_drawMode == TRIANGLES) {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments-1; x++) {
                if (y > 0){
                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x );
                    mesh.addIndex( (y)*_radiusSegments + x+1 );
                    mesh.addIndex( (y+1)*_radiusSegments + x );
                }

                // second triangle //
                mesh.addIndex( (y)*_radiusSegments + x+1 );
                mesh.addIndex( (y+1)*_radiusSegments + x+1 );
                mesh.addIndex( (y+1)*_radiusSegments + x );
            }
        }
    }
    else {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments; x++) {
                mesh.addIndex( (y)*_radiusSegments + x );
                mesh.addIndex( (y+1)*_radiusSegments + x );
            }
        }
    }

    vertOffset = mesh.getVerticesTotal();
    float maxTexYNormalized = (_heightSegments-1.f) / maxTexY;

    // add the cap //
    normal = glm::vec3(0.f, 1.f, 0.f);
    for (int iy = 0; iy < capSegs; iy++) {
        for (int ix = 0; ix < _radiusSegments; ix++) {
            newRad = remap((float)iy, 0, capSegs-1, radius, 0.0, true);
            vert.x = cos((float)ix*angleIncRadius) * newRad;
            vert.z = sin((float)ix*angleIncRadius) * newRad;
            vert.y = halfH;

            tcoord.x = (float)ix/((float)_radiusSegments-1.f);
            tcoord.y = 1.f - remap(iy, 0, capSegs-1, maxTexYNormalized, 1.f, true);

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );
            mesh.addNormal( normal );
        }
    }

    if (_drawMode == TRIANGLES) {
        if ( capSegs > 0 ) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {

                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);

                    if (y < capSegs-2) {
                        // second triangle //
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }
                }
            }
        }
    }
    else {
        if (capSegs > 0 ) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }
    }

    return mesh;
}